

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
edition_unittest::EnumParseTester::_InternalSerialize
          (EnumParseTester *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  bool bVar1;
  uintptr_t *puVar2;
  int iVar3;
  LongSooRep *pLVar4;
  LongSooRep *pLVar5;
  int *piVar6;
  uint8_t *puVar7;
  byte *extraout_RAX;
  byte *extraout_RAX_00;
  byte *extraout_RAX_01;
  byte *extraout_RAX_02;
  byte *extraout_RAX_03;
  byte *extraout_RAX_04;
  byte *extraout_RAX_05;
  byte *extraout_RAX_06;
  byte *extraout_RAX_07;
  byte *extraout_RAX_08;
  byte *extraout_RAX_09;
  byte *extraout_RAX_10;
  byte *extraout_RAX_11;
  byte *extraout_RAX_12;
  byte *extraout_RAX_13;
  byte *extraout_RAX_14;
  byte *extraout_RAX_15;
  byte *extraout_RAX_16;
  byte *extraout_RAX_17;
  byte *extraout_RAX_18;
  byte *extraout_RAX_19;
  byte *extraout_RAX_20;
  byte *extraout_RAX_21;
  byte *pbVar8;
  byte *extraout_RAX_22;
  uint uVar9;
  LongSooRep *in_RCX;
  LongSooRep *pLVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int *piVar15;
  LongSooRep *unaff_R13;
  byte *pbVar16;
  LongSooRep local_40;
  
  uVar14 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar14 & 1) == 0) goto LAB_00c713ce;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.optional_seq_small_0_lowfield_;
  pbVar8 = target + 1;
  *target = '\b';
  pLVar4 = in_RCX;
  if ((LongSooRep *)0x7f < in_RCX) goto LAB_00c73122;
  do {
    *pbVar8 = (byte)in_RCX;
    target = pbVar8 + 1;
LAB_00c713ce:
    uVar13 = *(uint *)((long)&this->field_0 + 0x30);
    pLVar4 = (LongSooRep *)(ulong)uVar13;
    if (uVar13 == 0) {
LAB_00c71494:
      uVar13 = *(uint *)((long)&this->field_0 + 0x48);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c7155a;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_0_lowfield_;
        *target = 0x1a;
        pbVar8 = target + 1;
        if (0x7f < uVar13) goto LAB_00c72b7a;
        goto LAB_00c714cc;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_00;
LAB_00c72bb9:
      do {
        target = pbVar8;
        uVar13 = (uint)pLVar4;
        *target = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c715c8:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_1_lowfield_.soo_rep_.field_0 + 8)
        ;
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c71656:
      uVar13 = *(uint *)((long)&this->field_0 + 0x78);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c71722;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_1_lowfield_;
        *target = 0x32;
        pbVar8 = target + 1;
        if (0x7f < uVar13) goto LAB_00c72bf8;
        goto LAB_00c71691;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_02;
LAB_00c72c37:
      do {
        target = pbVar8;
        uVar13 = (uint)pLVar4;
        *target = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c71795:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_large_lowfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c71826:
      uVar13 = *(uint *)((long)&this->field_0 + 0xa8);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c718f5;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_large_lowfield_;
        *target = 0x4a;
        pbVar8 = target + 1;
        if (0x7f < uVar13) goto LAB_00c72c76;
        goto LAB_00c71864;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_04;
LAB_00c72cb5:
      do {
        target = pbVar8;
        uVar13 = (uint)pLVar4;
        *target = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c71969:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_arbitrary_lowfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c719fa:
      uVar13 = *(uint *)((long)&this->field_0 + 0xd8);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c71ac9;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_arbitrary_lowfield_;
        *target = 0x62;
        pbVar8 = target + 1;
        if (0x7f < uVar13) goto LAB_00c72cf4;
        goto LAB_00c71a38;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_06;
LAB_00c72d33:
      do {
        pbVar16 = pbVar8;
        uVar13 = (uint)pLVar4;
        *pbVar16 = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = pbVar16 + 1;
      } while (0x3fff < uVar13);
LAB_00c71b7c:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_0_midfield_.soo_rep_.field_0 + 8)
        ;
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = pbVar16 + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c71c0d:
      uVar13 = *(uint *)((long)&this->field_0 + 0x108);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c71ce1;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_0_midfield_;
        target[0] = 0xda;
        target[1] = 0x3e;
        pbVar8 = target + 2;
        if (0x7f < uVar13) goto LAB_00c72d72;
        pbVar16 = target + 1;
        goto LAB_00c71c50;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_08;
LAB_00c72db1:
      do {
        pbVar16 = pbVar8;
        uVar13 = (uint)pLVar4;
        *pbVar16 = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = pbVar16 + 1;
      } while (0x3fff < uVar13);
LAB_00c71d5c:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_1_midfield_.soo_rep_.field_0 + 8)
        ;
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = pbVar16 + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c71ded:
      uVar13 = *(uint *)((long)&this->field_0 + 0x138);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c71ec1;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_1_midfield_;
        target[0] = 0xf2;
        target[1] = 0x3e;
        pbVar8 = target + 2;
        if (0x7f < uVar13) goto LAB_00c72df0;
        pbVar16 = target + 1;
        goto LAB_00c71e30;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_10;
LAB_00c72e2f:
      do {
        pbVar16 = pbVar8;
        uVar13 = (uint)pLVar4;
        *pbVar16 = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = pbVar16 + 1;
      } while (0x3fff < uVar13);
LAB_00c71f3c:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_large_midfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = pbVar16 + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c71fcd:
      uVar13 = *(uint *)((long)&this->field_0 + 0x168);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c720a1;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_large_midfield_;
        target[0] = 0x8a;
        target[1] = 0x3f;
        pbVar8 = target + 2;
        if (0x7f < uVar13) goto LAB_00c72e6e;
        pbVar16 = target + 1;
        goto LAB_00c72010;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_12;
LAB_00c72ead:
      do {
        pbVar16 = pbVar8;
        uVar13 = (uint)pLVar4;
        *pbVar16 = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = pbVar16 + 1;
      } while (0x3fff < uVar13);
LAB_00c7211c:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_arbitrary_midfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = pbVar16 + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c721ad:
      uVar13 = *(uint *)((long)&this->field_0 + 0x198);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c72281;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_arbitrary_midfield_;
        target[0] = 0xa2;
        target[1] = 0x3f;
        pbVar8 = target + 2;
        if (0x7f < uVar13) goto LAB_00c72eec;
        pbVar16 = target + 1;
        goto LAB_00c721f0;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_14;
LAB_00c72f2b:
      do {
        target = pbVar8;
        uVar13 = (uint)unaff_R13;
        *target = (byte)unaff_R13 | 0x80;
        unaff_R13 = (LongSooRep *)(ulong)(uVar13 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c722ea:
      *pbVar8 = (byte)unaff_R13;
      if ((pLVar4->elements_int & 4) == 0) {
        pLVar5 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_0_hifield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar5 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      pLVar4 = (LongSooRep *)((long)&pLVar5->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar5->elements_int;
        pLVar10 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar10 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar10 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar10;
            pLVar10 = in_RCX;
          } while (bVar1);
        }
        pLVar5 = (LongSooRep *)((long)&pLVar5->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar5 < pLVar4);
LAB_00c72382:
      uVar13 = *(uint *)((long)&this->field_0 + 0x1c8);
      unaff_R13 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c72479;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        pLVar4 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_0_hifield_;
        uVar9 = 0x7a121a;
        do {
          pbVar8 = target;
          *pbVar8 = (byte)uVar9 | 0x80;
          target = pbVar8 + 1;
          bVar1 = 0x3fff < uVar9;
          uVar9 = uVar9 >> 7;
        } while (bVar1);
        *target = 3;
        pbVar8 = pbVar8 + 2;
        if (0x7f < uVar13) goto LAB_00c72f6a;
        goto LAB_00c723e1;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_16;
LAB_00c72fa9:
      do {
        target = pbVar8;
        uVar13 = (uint)unaff_R13;
        *target = (byte)unaff_R13 | 0x80;
        unaff_R13 = (LongSooRep *)((ulong)unaff_R13 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c724e2:
      *pbVar8 = (byte)unaff_R13;
      if ((pLVar4->elements_int & 4) == 0) {
        pLVar5 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_1_hifield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar5 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      pLVar4 = (LongSooRep *)((long)&pLVar5->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar5->elements_int;
        pLVar10 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar10 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar10 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar10;
            pLVar10 = in_RCX;
          } while (bVar1);
        }
        pLVar5 = (LongSooRep *)((long)&pLVar5->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar5 < pLVar4);
LAB_00c7257a:
      uVar13 = *(uint *)((long)&this->field_0 + 0x1f8);
      unaff_R13 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c72671;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        pLVar4 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_1_hifield_;
        uVar9 = 0x7a1232;
        do {
          pbVar8 = target;
          *pbVar8 = (byte)uVar9 | 0x80;
          target = pbVar8 + 1;
          bVar1 = 0x3fff < uVar9;
          uVar9 = uVar9 >> 7;
        } while (bVar1);
        *target = 3;
        pbVar8 = pbVar8 + 2;
        if (0x7f < uVar13) goto LAB_00c72fe8;
        goto LAB_00c725d9;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_18;
LAB_00c73027:
      do {
        target = pbVar8;
        uVar13 = (uint)unaff_R13;
        *target = (byte)unaff_R13 | 0x80;
        unaff_R13 = (LongSooRep *)((ulong)unaff_R13 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c726da:
      *pbVar8 = (byte)unaff_R13;
      if ((pLVar4->elements_int & 4) == 0) {
        pLVar5 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_large_hifield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar5 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      pLVar4 = (LongSooRep *)((long)&pLVar5->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar5->elements_int;
        pLVar10 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar10 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar10 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar10;
            pLVar10 = in_RCX;
          } while (bVar1);
        }
        pLVar5 = (LongSooRep *)((long)&pLVar5->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar5 < pLVar4);
LAB_00c72772:
      uVar13 = *(uint *)((long)&this->field_0 + 0x228);
      unaff_R13 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c72869;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        pLVar4 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_large_hifield_;
        uVar9 = 0x7a124a;
        do {
          pbVar8 = target;
          *pbVar8 = (byte)uVar9 | 0x80;
          target = pbVar8 + 1;
          bVar1 = 0x3fff < uVar9;
          uVar9 = uVar9 >> 7;
        } while (bVar1);
        *target = 3;
        pbVar8 = pbVar8 + 2;
        if (0x7f < uVar13) goto LAB_00c73066;
        goto LAB_00c727d1;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_20;
LAB_00c730a5:
      do {
        target = pbVar8;
        *target = (byte)uVar14 | 0x80;
        uVar13 = uVar14 >> 7;
        pbVar8 = target + 1;
        bVar1 = 0x3fff < uVar14;
        uVar14 = uVar13;
      } while (bVar1);
LAB_00c728d0:
      *pbVar8 = (byte)uVar13;
      if ((pLVar4->elements_int & 4) == 0) {
        unaff_R13 = (LongSooRep *)
                    ((long)&(this->field_0)._impl_.repeated_arbitrary_hifield_.soo_rep_.field_0 + 8)
        ;
      }
      else {
        unaff_R13 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      puVar2 = &unaff_R13->elements_int;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)unaff_R13->elements_int;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        unaff_R13 = (LongSooRep *)((long)&unaff_R13->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (unaff_R13 < (LongSooRep *)((long)puVar2 + (long)iVar3 * 4));
    }
    else {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        this_00 = &(this->field_0)._impl_.repeated_seq_small_0_lowfield_;
        *target = 0x12;
        pbVar8 = target + 1;
        if (0x7f < uVar13) {
          do {
            target = pbVar8;
            uVar13 = (uint)pLVar4;
            *target = (byte)pLVar4 | 0x80;
            pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar8 = target + 1;
          } while (0x3fff < uVar13);
        }
        *pbVar8 = (byte)pLVar4;
        if ((undefined1  [16])
            ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
            (undefined1  [16])0x0) {
          pLVar4 = (LongSooRep *)
                   ((long)&(this->field_0)._impl_.repeated_seq_small_0_lowfield_.soo_rep_.field_0 +
                   8);
        }
        else {
          pLVar4 = (LongSooRep *)
                   google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
        }
        target = target + 2;
        iVar3 = google::protobuf::internal::SooRep::size
                          (&this_00->soo_rep_,
                           (undefined1  [16])
                           ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4)
                           == (undefined1  [16])0x0);
        unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
        do {
          if (stream->end_ <= target) {
            target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
          }
          in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
          pLVar5 = in_RCX;
          if ((LongSooRep *)0x7f < in_RCX) {
            do {
              *target = (byte)pLVar5 | 0x80;
              in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
              target = target + 1;
              bVar1 = (LongSooRep *)0x3fff < pLVar5;
              pLVar5 = in_RCX;
            } while (bVar1);
          }
          pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
          *target = (byte)in_RCX;
          target = target + 1;
        } while (pLVar4 < unaff_R13);
        goto LAB_00c71494;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX;
LAB_00c72b7a:
      do {
        target = pbVar8;
        uVar13 = (uint)pLVar4;
        *target = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c714cc:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_0_lowfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c7155a:
      if ((uVar14 & 2) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.optional_seq_small_1_lowfield_;
        pbVar8 = target + 1;
        *target = 0x20;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *pbVar8 = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar8 = pbVar8 + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        *pbVar8 = (byte)in_RCX;
        target = pbVar8 + 1;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0x60);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c71656;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_1_lowfield_;
        *target = 0x2a;
        pbVar8 = target + 1;
        if (0x7f < uVar13) goto LAB_00c72bb9;
        goto LAB_00c715c8;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_01;
LAB_00c72bf8:
      do {
        target = pbVar8;
        uVar13 = (uint)pLVar4;
        *target = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c71691:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_1_lowfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c71722:
      if ((char)uVar14 < '\0') {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.optional_seq_large_lowfield_;
        pbVar8 = target + 1;
        *target = 0x38;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *pbVar8 = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar8 = pbVar8 + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        *pbVar8 = (byte)in_RCX;
        target = pbVar8 + 1;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0x90);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c71826;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_large_lowfield_;
        *target = 0x42;
        pbVar8 = target + 1;
        if (0x7f < uVar13) goto LAB_00c72c37;
        goto LAB_00c71795;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_03;
LAB_00c72c76:
      do {
        target = pbVar8;
        uVar13 = (uint)pLVar4;
        *target = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c71864:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_large_lowfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c718f5:
      if ((uVar14 >> 8 & 1) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.optional_arbitrary_lowfield_;
        pbVar8 = target + 1;
        *target = 0x50;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *pbVar8 = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar8 = pbVar8 + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        *pbVar8 = (byte)in_RCX;
        target = pbVar8 + 1;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0xc0);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c719fa;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_arbitrary_lowfield_;
        *target = 0x5a;
        pbVar8 = target + 1;
        if (0x7f < uVar13) goto LAB_00c72cb5;
        goto LAB_00c71969;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_05;
LAB_00c72cf4:
      do {
        target = pbVar8;
        uVar13 = (uint)pLVar4;
        *target = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c71a38:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_arbitrary_lowfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c71ac9:
      if ((uVar14 & 4) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.other_field_;
        pbVar8 = target + 2;
        target[0] = 0x98;
        target[1] = 6;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *pbVar8 = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar8 = pbVar8 + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        *pbVar8 = (byte)in_RCX;
        target = pbVar8 + 1;
      }
      if ((uVar14 & 8) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.optional_seq_small_0_midfield_;
        pbVar8 = target + 2;
        target[0] = 200;
        target[1] = 0x3e;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *pbVar8 = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar8 = pbVar8 + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        *pbVar8 = (byte)in_RCX;
        target = pbVar8 + 1;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0xf0);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c71c0d;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_0_midfield_;
        target[0] = 0xd2;
        target[1] = 0x3e;
        pbVar8 = target + 2;
        if (0x7f < uVar13) goto LAB_00c72d33;
        pbVar16 = target + 1;
        goto LAB_00c71b7c;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_07;
LAB_00c72d72:
      do {
        pbVar16 = pbVar8;
        uVar13 = (uint)pLVar4;
        *pbVar16 = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = pbVar16 + 1;
      } while (0x3fff < uVar13);
LAB_00c71c50:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_0_midfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = pbVar16 + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c71ce1:
      if ((uVar14 & 0x40) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.optional_seq_small_1_midfield_;
        pbVar8 = target + 2;
        target[0] = 0xe0;
        target[1] = 0x3e;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *pbVar8 = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar8 = pbVar8 + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        *pbVar8 = (byte)in_RCX;
        target = pbVar8 + 1;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0x120);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c71ded;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_1_midfield_;
        target[0] = 0xea;
        target[1] = 0x3e;
        pbVar8 = target + 2;
        if (0x7f < uVar13) goto LAB_00c72db1;
        pbVar16 = target + 1;
        goto LAB_00c71d5c;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_09;
LAB_00c72df0:
      do {
        pbVar16 = pbVar8;
        uVar13 = (uint)pLVar4;
        *pbVar16 = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = pbVar16 + 1;
      } while (0x3fff < uVar13);
LAB_00c71e30:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_1_midfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = pbVar16 + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c71ec1:
      if ((uVar14 >> 9 & 1) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.optional_seq_large_midfield_;
        pbVar8 = target + 2;
        target[0] = 0xf8;
        target[1] = 0x3e;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *pbVar8 = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar8 = pbVar8 + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        *pbVar8 = (byte)in_RCX;
        target = pbVar8 + 1;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0x150);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c71fcd;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_large_midfield_;
        target[0] = 0x82;
        target[1] = 0x3f;
        pbVar8 = target + 2;
        if (0x7f < uVar13) goto LAB_00c72e2f;
        pbVar16 = target + 1;
        goto LAB_00c71f3c;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_11;
LAB_00c72e6e:
      do {
        pbVar16 = pbVar8;
        uVar13 = (uint)pLVar4;
        *pbVar16 = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = pbVar16 + 1;
      } while (0x3fff < uVar13);
LAB_00c72010:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_large_midfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = pbVar16 + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c720a1:
      if ((uVar14 >> 10 & 1) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.optional_arbitrary_midfield_;
        pbVar8 = target + 2;
        target[0] = 0x90;
        target[1] = 0x3f;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *pbVar8 = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar8 = pbVar8 + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        *pbVar8 = (byte)in_RCX;
        target = pbVar8 + 1;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0x180);
      pLVar4 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c721ad;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_arbitrary_midfield_;
        target[0] = 0x9a;
        target[1] = 0x3f;
        pbVar8 = target + 2;
        if (0x7f < uVar13) goto LAB_00c72ead;
        pbVar16 = target + 1;
        goto LAB_00c7211c;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_13;
LAB_00c72eec:
      do {
        pbVar16 = pbVar8;
        uVar13 = (uint)pLVar4;
        *pbVar16 = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar8 = pbVar16 + 1;
      } while (0x3fff < uVar13);
LAB_00c721f0:
      *pbVar8 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_arbitrary_midfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = pbVar16 + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      puVar2 = &pLVar4->elements_int;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < (LongSooRep *)((long)puVar2 + (long)iVar3 * 4));
LAB_00c72281:
      if ((uVar14 & 0x10) != 0) {
        pLVar4 = &local_40;
        in_RCX = pLVar4;
        _InternalSerialize();
        target = (uint8_t *)local_40.elements_int;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0x1b0);
      unaff_R13 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c72382;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        pLVar4 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_0_hifield_;
        uVar9 = 0x7a1212;
        do {
          pbVar8 = target;
          *pbVar8 = (byte)uVar9 | 0x80;
          target = pbVar8 + 1;
          bVar1 = 0x3fff < uVar9;
          uVar9 = uVar9 >> 7;
        } while (bVar1);
        *target = 3;
        pbVar8 = pbVar8 + 2;
        if (0x7f < uVar13) goto LAB_00c72f2b;
        goto LAB_00c722ea;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_15;
LAB_00c72f6a:
      do {
        target = pbVar8;
        uVar13 = (uint)unaff_R13;
        *target = (byte)unaff_R13 | 0x80;
        unaff_R13 = (LongSooRep *)((ulong)unaff_R13 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c723e1:
      *pbVar8 = (byte)unaff_R13;
      if ((pLVar4->elements_int & 4) == 0) {
        pLVar5 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_0_hifield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar5 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      pLVar4 = (LongSooRep *)((long)&pLVar5->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar5->elements_int;
        pLVar10 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar10 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar10 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar10;
            pLVar10 = in_RCX;
          } while (bVar1);
        }
        pLVar5 = (LongSooRep *)((long)&pLVar5->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar5 < pLVar4);
LAB_00c72479:
      if ((uVar14 & 0x20) != 0) {
        pLVar4 = &local_40;
        in_RCX = pLVar4;
        _InternalSerialize();
        target = (uint8_t *)local_40.elements_int;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0x1e0);
      unaff_R13 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c7257a;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        pLVar4 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_1_hifield_;
        uVar9 = 0x7a122a;
        do {
          pbVar8 = target;
          *pbVar8 = (byte)uVar9 | 0x80;
          target = pbVar8 + 1;
          bVar1 = 0x3fff < uVar9;
          uVar9 = uVar9 >> 7;
        } while (bVar1);
        *target = 3;
        pbVar8 = pbVar8 + 2;
        if (0x7f < uVar13) goto LAB_00c72fa9;
        goto LAB_00c724e2;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_17;
LAB_00c72fe8:
      do {
        target = pbVar8;
        uVar13 = (uint)unaff_R13;
        *target = (byte)unaff_R13 | 0x80;
        unaff_R13 = (LongSooRep *)((ulong)unaff_R13 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c725d9:
      *pbVar8 = (byte)unaff_R13;
      if ((pLVar4->elements_int & 4) == 0) {
        pLVar5 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_1_hifield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar5 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      pLVar4 = (LongSooRep *)((long)&pLVar5->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar5->elements_int;
        pLVar10 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar10 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar10 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar10;
            pLVar10 = in_RCX;
          } while (bVar1);
        }
        pLVar5 = (LongSooRep *)((long)&pLVar5->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar5 < pLVar4);
LAB_00c72671:
      if ((uVar14 >> 0xb & 1) != 0) {
        pLVar4 = &local_40;
        in_RCX = pLVar4;
        _InternalSerialize();
        target = (uint8_t *)local_40.elements_int;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0x210);
      unaff_R13 = (LongSooRep *)(ulong)uVar13;
      if (uVar13 == 0) goto LAB_00c72772;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        pLVar4 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_large_hifield_;
        uVar9 = 0x7a1242;
        do {
          pbVar8 = target;
          *pbVar8 = (byte)uVar9 | 0x80;
          target = pbVar8 + 1;
          bVar1 = 0x3fff < uVar9;
          uVar9 = uVar9 >> 7;
        } while (bVar1);
        *target = 3;
        pbVar8 = pbVar8 + 2;
        if (0x7f < uVar13) goto LAB_00c73027;
        goto LAB_00c726da;
      }
      _InternalSerialize();
      pbVar8 = extraout_RAX_19;
LAB_00c73066:
      do {
        target = pbVar8;
        uVar13 = (uint)unaff_R13;
        *target = (byte)unaff_R13 | 0x80;
        unaff_R13 = (LongSooRep *)((ulong)unaff_R13 >> 7);
        pbVar8 = target + 1;
      } while (0x3fff < uVar13);
LAB_00c727d1:
      *pbVar8 = (byte)unaff_R13;
      if ((pLVar4->elements_int & 4) == 0) {
        unaff_R13 = (LongSooRep *)
                    ((long)&(this->field_0)._impl_.packed_seq_large_hifield_.soo_rep_.field_0 + 8);
      }
      else {
        unaff_R13 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      pLVar4 = (LongSooRep *)((long)&unaff_R13->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)unaff_R13->elements_int;
        pLVar5 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar5 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar5 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar5;
            pLVar5 = in_RCX;
          } while (bVar1);
        }
        unaff_R13 = (LongSooRep *)((long)&unaff_R13->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (unaff_R13 < pLVar4);
LAB_00c72869:
      if ((uVar14 >> 0xc & 1) != 0) {
        pLVar4 = &local_40;
        in_RCX = pLVar4;
        _InternalSerialize();
        target = (uint8_t *)local_40.elements_int;
      }
      uVar13 = *(uint *)((long)&this->field_0 + 0x240);
      if (uVar13 != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        if (target < stream->end_) {
          pLVar4 = (LongSooRep *)&(this->field_0)._impl_.repeated_arbitrary_hifield_;
          uVar14 = 0x7a125a;
          do {
            pbVar8 = target;
            *pbVar8 = (byte)uVar14 | 0x80;
            target = pbVar8 + 1;
            bVar1 = 0x3fff < uVar14;
            uVar14 = uVar14 >> 7;
          } while (bVar1);
          *target = 3;
          pbVar8 = pbVar8 + 2;
          uVar14 = uVar13;
          if (0x7f < uVar13) goto LAB_00c730a5;
          goto LAB_00c728d0;
        }
        _InternalSerialize();
        pbVar8 = extraout_RAX_21;
        goto LAB_00c730e2;
      }
    }
    uVar14 = *(uint *)((long)&this->field_0 + 600);
    if (uVar14 == 0) goto LAB_00c72a5d;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      pLVar4 = (LongSooRep *)&(this->field_0)._impl_.packed_arbitrary_hifield_;
      uVar13 = 0x7a1262;
      do {
        pbVar8 = target;
        *pbVar8 = (byte)uVar13 | 0x80;
        target = pbVar8 + 1;
        bVar1 = 0x3fff < uVar13;
        uVar13 = uVar13 >> 7;
      } while (bVar1);
      *target = 3;
      pbVar8 = pbVar8 + 2;
      uVar13 = uVar14;
      if (0x7f < uVar14) {
LAB_00c730e2:
        do {
          target = pbVar8;
          *target = (byte)uVar13 | 0x80;
          uVar14 = uVar13 >> 7;
          pbVar8 = target + 1;
          bVar1 = 0x3fff < uVar13;
          uVar13 = uVar14;
        } while (bVar1);
      }
      *pbVar8 = (byte)uVar14;
      if ((pLVar4->elements_int & 4) == 0) {
        piVar6 = (int *)((long)&this->field_0 + 0x250);
      }
      else {
        piVar6 = (int *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      piVar15 = piVar6 + iVar3;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar11 = (ulong)*piVar6;
        uVar12 = uVar11;
        if (0x7f < uVar11) {
          do {
            *target = (byte)uVar12 | 0x80;
            uVar11 = uVar12 >> 7;
            target = target + 1;
            bVar1 = 0x3fff < uVar12;
            uVar12 = uVar11;
          } while (bVar1);
        }
        piVar6 = piVar6 + 1;
        *target = (byte)uVar11;
        target = target + 1;
      } while (piVar6 < piVar15);
LAB_00c72a5d:
      if (*(short *)((long)&this->field_0 + 10) != 0) {
        target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                           (&(this->field_0)._impl_._extensions_,
                            (MessageLite *)_EnumParseTester_default_instance_,target,stream);
      }
      uVar12 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar12 & 1) != 0) {
        puVar7 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                           ((UnknownFieldSet *)((uVar12 & 0xfffffffffffffffe) + 8),target,stream);
        return puVar7;
      }
      return target;
    }
    _InternalSerialize();
    pbVar8 = extraout_RAX_22;
    pLVar4 = in_RCX;
LAB_00c73122:
    do {
      *pbVar8 = (byte)pLVar4 | 0x80;
      in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
      pbVar8 = pbVar8 + 1;
      bVar1 = (LongSooRep *)0x3fff < pLVar4;
      pLVar4 = in_RCX;
    } while (bVar1);
  } while( true );
}

Assistant:

::uint8_t* PROTOBUF_NONNULL EnumParseTester::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const EnumParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.EnumParseTester)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_lowfield = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_optional_seq_small_0_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_lowfield = 2;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          2, this_._internal_repeated_seq_small_0_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_lowfield = 3 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          3, this_._internal_packed_seq_small_0_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_lowfield = 4;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_optional_seq_small_1_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_lowfield = 5;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          5, this_._internal_repeated_seq_small_1_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_lowfield = 6 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          6, this_._internal_packed_seq_small_1_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_lowfield = 7;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        7, this_._internal_optional_seq_large_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_lowfield = 8;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          8, this_._internal_repeated_seq_large_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_lowfield = 9 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          9, this_._internal_packed_seq_large_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_lowfield = 10;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        10, this_._internal_optional_arbitrary_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_lowfield = 11;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          11, this_._internal_repeated_arbitrary_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_lowfield = 12 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          12, this_._internal_packed_arbitrary_lowfield(), byte_size, target);
    }
  }

  // int32 other_field = 99;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        99, this_._internal_other_field(), target);
  }

  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_midfield = 1001;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1001, this_._internal_optional_seq_small_0_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_midfield = 1002;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1002, this_._internal_repeated_seq_small_0_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_midfield = 1003 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1003, this_._internal_packed_seq_small_0_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_midfield = 1004;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1004, this_._internal_optional_seq_small_1_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_midfield = 1005;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1005, this_._internal_repeated_seq_small_1_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_midfield = 1006 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1006, this_._internal_packed_seq_small_1_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_midfield = 1007;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1007, this_._internal_optional_seq_large_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_midfield = 1008;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1008, this_._internal_repeated_seq_large_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_midfield = 1009 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1009, this_._internal_packed_seq_large_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_midfield = 1010;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1010, this_._internal_optional_arbitrary_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_midfield = 1011;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1011, this_._internal_repeated_arbitrary_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_midfield = 1012 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1012, this_._internal_packed_arbitrary_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_hifield = 1000001;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000001, this_._internal_optional_seq_small_0_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_hifield = 1000002;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000002, this_._internal_repeated_seq_small_0_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_hifield = 1000003 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000003, this_._internal_packed_seq_small_0_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_hifield = 1000004;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000004, this_._internal_optional_seq_small_1_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_hifield = 1000005;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000005, this_._internal_repeated_seq_small_1_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_hifield = 1000006 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000006, this_._internal_packed_seq_small_1_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_hifield = 1000007;
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000007, this_._internal_optional_seq_large_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_hifield = 1000008;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000008, this_._internal_repeated_seq_large_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_hifield = 1000009 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000009, this_._internal_packed_seq_large_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_hifield = 1000010;
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000010, this_._internal_optional_arbitrary_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_hifield = 1000011;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000011, this_._internal_repeated_arbitrary_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_hifield = 1000012 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000012, this_._internal_packed_arbitrary_hifield(), byte_size, target);
    }
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.EnumParseTester)
  return target;
}